

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

int db_upvalueid(lua_State *L)

{
  void *p;
  
  p = checkupval(L,1,2,(int *)0x0);
  if (p == (void *)0x0) {
    lua_pushnil(L);
  }
  else {
    lua_pushlightuserdata(L,p);
  }
  return 1;
}

Assistant:

static int db_upvalueid (lua_State *L) {
  void *id = checkupval(L, 1, 2, NULL);
  if (id != NULL)
    lua_pushlightuserdata(L, id);
  else
    luaL_pushfail(L);
  return 1;
}